

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleSerializer.cpp
# Opt level: O0

void __thiscall SimpleSerializer::Clear(SimpleSerializer *this,ObjectId ownerId,char *propertyName)

{
  iterator __s;
  bool bVar1;
  pointer ppVar2;
  pointer ppVar3;
  _Self local_80 [3];
  allocator<char> local_61;
  key_type local_60;
  _Self local_40;
  iterator propertyFound;
  _Self local_30;
  iterator found;
  char *propertyName_local;
  SimpleSerializer *this_local;
  ObjectId ownerId_local;
  
  ownerId_local.m_PerTypeId = ownerId.m_ConstructorId;
  this_local = (SimpleSerializer *)ownerId.m_PerTypeId;
  found._M_node = (_Base_ptr)propertyName;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<ObjectId,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*>_>_>,_std::less<ObjectId>,_std::allocator<std::pair<const_ObjectId,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*>_>_>_>_>_>
       ::find(&this->m_map,(key_type *)&this_local);
  propertyFound._M_node =
       (_Base_ptr)
       std::
       map<ObjectId,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*>_>_>,_std::less<ObjectId>,_std::allocator<std::pair<const_ObjectId,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*>_>_>_>_>_>
       ::end(&this->m_map);
  bVar1 = std::operator!=(&local_30,(_Self *)&propertyFound);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_ObjectId,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*>_>_>_>_>
             ::operator->(&local_30);
    __s = found;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,(char *)__s._M_node,&local_61);
    local_40._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*>_>_>
         ::find(&ppVar2->second,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_ObjectId,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*>_>_>_>_>
             ::operator->(&local_30);
    local_80[0]._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*>_>_>
         ::end(&ppVar2->second);
    bVar1 = std::operator!=(&local_40,local_80);
    if (bVar1) {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*>_>
               ::operator->(&local_40);
      if (ppVar3->second != (ISerializedValue *)0x0) {
        (**(code **)(*(long *)ppVar3->second + 8))();
      }
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_ObjectId,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*>_>_>_>_>
               ::operator->(&local_30);
      std::
      map<std::__cxx11::string,ISerializedValue_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ISerializedValue_const*>>>
      ::erase_abi_cxx11_((map<std::__cxx11::string,ISerializedValue_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ISerializedValue_const*>>>
                          *)&ppVar2->second,(iterator)local_40._M_node);
    }
  }
  return;
}

Assistant:

void SimpleSerializer::Clear(ObjectId ownerId, const char* propertyName)
{
	TSerializationMap::iterator found = m_map.find(ownerId);
	if (found != m_map.end())
	{
		TValueGroup::iterator propertyFound = found->second.find(propertyName);
		if (propertyFound != found->second.end())
		{
			delete propertyFound->second;
			found->second.erase(propertyFound);
		}
	}
}